

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyOper.c
# Opt level: O0

Ivy_Obj_t * Ivy_Multi_rec(Ivy_Man_t *p,Ivy_Obj_t **ppObjs,int nObjs,Ivy_Type_t Type)

{
  Ivy_Obj_t *p0;
  Ivy_Obj_t *p1;
  Ivy_Obj_t *pObj2;
  Ivy_Obj_t *pObj1;
  Ivy_Type_t Type_local;
  int nObjs_local;
  Ivy_Obj_t **ppObjs_local;
  Ivy_Man_t *p_local;
  
  if (nObjs == 1) {
    p_local = (Ivy_Man_t *)*ppObjs;
  }
  else {
    p0 = Ivy_Multi_rec(p,ppObjs,nObjs / 2,Type);
    p1 = Ivy_Multi_rec(p,ppObjs + nObjs / 2,nObjs - nObjs / 2,Type);
    p_local = (Ivy_Man_t *)Ivy_Oper(p,p0,p1,Type);
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_Multi_rec( Ivy_Man_t * p, Ivy_Obj_t ** ppObjs, int nObjs, Ivy_Type_t Type )
{
    Ivy_Obj_t * pObj1, * pObj2;
    if ( nObjs == 1 )
        return ppObjs[0];
    pObj1 = Ivy_Multi_rec( p, ppObjs,           nObjs/2,         Type );
    pObj2 = Ivy_Multi_rec( p, ppObjs + nObjs/2, nObjs - nObjs/2, Type );
    return Ivy_Oper( p, pObj1, pObj2, Type );
}